

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  StreamingListener *pSVar1;
  char *in_RDX;
  char *str;
  StreamingListener *this_00;
  int local_134;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (StreamingListener *)(test_part_result->file_name_)._M_string_length;
  if (pSVar1 != (StreamingListener *)0x0) {
    pSVar1 = (StreamingListener *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  this_00 = (StreamingListener *)0x1d88b3;
  if (pSVar1 != (StreamingListener *)0x0) {
    this_00 = pSVar1;
  }
  UrlEncode_abi_cxx11_(&local_130,this_00,in_RDX);
  std::operator+(&local_110,"event=TestPartResult&file=",&local_130);
  std::operator+(&local_b0,&local_110,"&line=");
  local_134 = test_part_result->line_number_;
  StreamableToString<int>(&local_d0,&local_134);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90,"&message=");
  UrlEncode_abi_cxx11_
            (&local_f0,(StreamingListener *)(test_part_result->message_)._M_dataplus._M_p,str);
  std::operator+(&local_50,&local_70,&local_f0);
  SendLn(this,&local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) override {
    const char* file_name = test_part_result.file_name();
    if (file_name == nullptr) file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }